

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::throwError(StructuralParser *this,CompileMessage *message)

{
  Context CStack_58;
  CompileMessage local_40;
  
  getContext(&CStack_58,this);
  CompileMessage::CompileMessage(&local_40,message);
  AST::Context::throwError(&CStack_58,&local_40,false);
}

Assistant:

[[noreturn]] void throwError (const CompileMessage& message) const override
    {
        getContext().throwError (message);
    }